

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_dump.h
# Opt level: O0

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
::phmap_load<phmap::BinaryInputArchive>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
           *this,BinaryInputArchive *ar)

{
  BinaryInputArchive *this_00;
  size_t *p;
  ulong local_58;
  size_t version;
  BinaryInputArchive *local_20;
  BinaryInputArchive *ar_local;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_local;
  
  local_20 = ar;
  ar_local = (BinaryInputArchive *)this;
  raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&version);
  swap((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
        *)&version,this);
  ~raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&version);
  local_58 = 0;
  BinaryInputArchive::loadBinary(local_20,&local_58,8);
  if (local_58 < 0xfffffffffffffff5) {
    this->size_ = local_58;
  }
  else {
    BinaryInputArchive::loadBinary(local_20,&this->size_,8);
  }
  BinaryInputArchive::loadBinary(local_20,&this->capacity_,8);
  if (this->capacity_ != 0) {
    initialize_slots(this,this->capacity_);
  }
  if (this->size_ != 0) {
    BinaryInputArchive::loadBinary(local_20,this->ctrl_,this->capacity_ + 0x11);
    BinaryInputArchive::loadBinary(local_20,this->slots_,this->capacity_ << 2);
    this_00 = local_20;
    if (local_58 < 0xfffffffffffffff5) {
      drop_deletes_without_resize(this);
    }
    else {
      p = growth_left(this);
      BinaryInputArchive::loadBinary(this_00,p,8);
    }
  }
  return true;
}

Assistant:

bool raw_hash_set<Policy, Hash, Eq, Alloc>::phmap_load(InputArchive& ar) {
    static_assert(type_traits_internal::IsTriviallyCopyable<value_type>::value,
                    "value_type should be trivially copyable");
    raw_hash_set<Policy, Hash, Eq, Alloc>().swap(*this); // clear any existing content

    size_t version = 0;
    ar.loadBinary(&version, sizeof(size_t));
    if (version < s_version_base) {
        // we didn't store the version, version actually contains the size
        size_ = version;
    } else {
        ar.loadBinary(&size_, sizeof(size_t));
    }
    ar.loadBinary(&capacity_, sizeof(size_t));

    if (capacity_) {
        // allocate memory for ctrl_ and slots_
        initialize_slots(capacity_);
    }
    if (size_ == 0)
        return true;
    ar.loadBinary(ctrl_,  sizeof(ctrl_t) * (capacity_ + Group::kWidth + 1));
    ar.loadBinary(slots_, sizeof(slot_type) * capacity_);
    if (version >= s_version_base) {
        // growth_left should be restored after calling initialize_slots() which resets it.
        ar.loadBinary(&growth_left(), sizeof(size_t));
    } else {
       drop_deletes_without_resize();
    }
    return true;
}